

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O1

void __thiscall luna::GC::SweepGeneration(GC *this,GenInfo *gen)

{
  byte bVar1;
  GCObject *pGVar2;
  uint local_3c;
  GCObject *local_38;
  
  local_38 = gen->gen_;
  if (local_38 == (GCObject *)0x0) {
    pGVar2 = (GCObject *)0x0;
  }
  else {
    pGVar2 = (GCObject *)0x0;
    do {
      gen->gen_ = local_38->next_;
      bVar1 = local_38->field_0x10;
      if ((bVar1 & 0xc) == 4) {
        local_38->field_0x10 = bVar1 & 0xf3;
        local_38->next_ = pGVar2;
        pGVar2 = local_38;
      }
      else {
        local_3c = (uint)(bVar1 >> 4);
        if ((this->obj_deleter_).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(this->obj_deleter_)._M_invoker)((_Any_data *)&this->obj_deleter_,&local_38,&local_3c);
        gen->count_ = gen->count_ - 1;
      }
      local_38 = gen->gen_;
    } while (local_38 != (GCObject *)0x0);
  }
  gen->gen_ = pGVar2;
  return;
}

Assistant:

void GC::SweepGeneration(GenInfo &gen)
    {
        GCObject *alived = nullptr;

        while (gen.gen_)
        {
            GCObject *obj = gen.gen_;
            gen.gen_ = obj->next_;

            if (obj->gc_ == GCFlag_Black)
            {
                obj->gc_ = GCFlag_White;
                obj->next_ = alived;
                alived = obj;
            }
            else
            {
                obj_deleter_(obj, obj->gc_obj_type_);
                gen.count_--;
            }
        }

        gen.gen_ = alived;
    }